

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_Forward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  double dVar1;
  complex<double> **ppcVar2;
  complex<double> *pcVar3;
  undefined1 auVar4 [16];
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  long lVar7;
  long lVar8;
  complex<double> *__z;
  long lVar9;
  complex<double> *pcVar10;
  long lVar11;
  double dVar12;
  undefined8 uVar13;
  double dVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  long local_80;
  long local_70;
  double dStack_60;
  double local_58;
  double local_50;
  long local_40;
  TPZSkylMatrix<std::complex<double>_> *local_38;
  
  lVar9 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar5 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar9 != CONCAT44(extraout_var,iVar5)) ||
     ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<std::complex<double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<double>>::Subst_Forward(TPZFMatrix<TVar> *) const [TVar = std::complex<double>]"
               ,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
  }
  iVar5 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  lVar9 = CONCAT44(extraout_var_00,iVar5);
  if (0 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) {
    local_70 = 0;
    local_80 = 0;
    local_40 = lVar9;
    local_38 = this;
    do {
      if (lVar9 < 1) {
        lVar8 = 0;
LAB_00cc12bb:
        if (lVar8 < lVar9) {
          lVar11 = lVar8 * 0x10 + -0x10;
          do {
            ppcVar2 = (this->fElem).fStore;
            pcVar3 = ppcVar2[lVar8 + 1];
            lVar9 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
            if ((lVar9 <= lVar8) ||
               ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= local_80)) {
              TPZFMatrix<std::complex<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pcVar10 = ppcVar2[lVar8] + 1;
            dVar1 = 0.0;
            dStack_60 = 0.0;
            dVar12 = 0.0;
            dVar14 = 0.0;
            if (pcVar10 < pcVar3) {
              __z = (complex<double> *)(B->fElem->_M_value + lVar9 * local_70 + lVar11);
              do {
                auVar4._8_4_ = SUB84(dStack_60,0);
                auVar4._0_8_ = dVar1;
                auVar4._12_4_ = (int)((ulong)dStack_60 >> 0x20);
                local_58 = *(double *)pcVar10->_M_value;
                local_50 = -*(double *)(pcVar10->_M_value + 8);
                std::complex<double>::operator*=((complex<double> *)&local_58,__z);
                dStack_60 = auVar4._8_8_;
                dVar1 = dVar1 + local_58;
                dStack_60 = dStack_60 + local_50;
                pcVar10 = pcVar10 + 1;
                __z = __z + -1;
              } while (pcVar10 < pcVar3);
              lVar9 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
              dVar12 = dVar1;
              dVar14 = dStack_60;
            }
            this = local_38;
            if ((lVar9 <= lVar8) ||
               ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= local_80)) {
              TPZFMatrix<std::complex<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar9 = lVar9 * local_80;
            pcVar3 = B->fElem;
            lVar7 = lVar8 + 1;
            dVar12 = *(double *)pcVar3[lVar9 + lVar8]._M_value - dVar12;
            dVar14 = *(double *)(pcVar3[lVar9 + lVar8]._M_value + 8) - dVar14;
            *(double *)pcVar3[lVar9 + lVar8]._M_value = dVar12;
            *(double *)(pcVar3[lVar9 + lVar8]._M_value + 8) = dVar14;
            pcVar10 = (local_38->fElem).fStore[lVar8];
            uVar15 = SUB84(dVar14,0);
            uVar16 = (undefined4)((ulong)dVar14 >> 0x20);
            uVar13 = __divdc3(dVar12,uVar15,*(undefined8 *)pcVar10->_M_value,
                              *(undefined8 *)(pcVar10->_M_value + 8));
            *(undefined8 *)pcVar3[lVar9 + lVar8]._M_value = uVar13;
            *(ulong *)(pcVar3[lVar9 + lVar8]._M_value + 8) = CONCAT44(uVar16,uVar15);
            lVar11 = lVar11 + 0x10;
            lVar8 = lVar7;
            lVar9 = local_40;
          } while (lVar7 != local_40);
        }
      }
      else {
        lVar11 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
        lVar7 = 8;
        lVar8 = 0;
        do {
          if ((lVar11 <= lVar8) ||
             ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= local_80)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = local_70 * lVar11;
          dVar1 = *(double *)(B->fElem->_M_value + lVar7 + -8 + lVar6);
          if ((((dVar1 != 0.0) || (NAN(dVar1))) ||
              (dVar1 = *(double *)(B->fElem->_M_value + lVar7 + lVar6), dVar1 != 0.0)) ||
             (NAN(dVar1))) goto LAB_00cc12bb;
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar9 != lVar8);
      }
      local_80 = local_80 + 1;
      local_70 = local_70 + 0x10;
    } while (local_80 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}